

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall QMainWindowLayoutState::contains(QMainWindowLayoutState *this,QWidget *widget)

{
  QLayoutItem *pQVar1;
  qsizetype qVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  bool bVar4;
  QArrayDataPointer<int> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->dockAreaLayout).centralWidgetItem;
  if (pQVar1 != (QLayoutItem *)0x0) {
    iVar3 = (*pQVar1->_vptr_QLayoutItem[0xd])();
    if ((QWidget *)CONCAT44(extraout_var,iVar3) == widget) {
      bVar4 = true;
      goto LAB_004002b3;
    }
  }
  QDockAreaLayout::indexOf((QList<int> *)&QStack_48,&this->dockAreaLayout,widget);
  qVar2 = QStack_48.size;
  QArrayDataPointer<int>::~QArrayDataPointer(&QStack_48);
  bVar4 = true;
  if (qVar2 == 0) {
    QToolBarAreaLayout::indexOf((QList<int> *)&QStack_48,&this->toolBarAreaLayout,widget);
    bVar4 = QStack_48.size != 0;
    QArrayDataPointer<int>::~QArrayDataPointer(&QStack_48);
  }
LAB_004002b3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::contains(QWidget *widget) const
{
#if QT_CONFIG(dockwidget)
    if (dockAreaLayout.centralWidgetItem != nullptr && dockAreaLayout.centralWidgetItem->widget() == widget)
        return true;
    if (!dockAreaLayout.indexOf(widget).isEmpty())
        return true;
#else
    if (centralWidgetItem && centralWidgetItem->widget() == widget)
        return true;
#endif

#if QT_CONFIG(toolbar)
    if (!toolBarAreaLayout.indexOf(widget).isEmpty())
        return true;
#endif
    return false;
}